

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fRboStateQueryTests.cpp
# Opt level: O2

void __thiscall
deqp::gles2::Functional::anon_unknown_1::RboInternalFormatCase::test(RboInternalFormatCase *this)

{
  CallLogWrapper *this_00;
  GLenum internalformat;
  uint in_EAX;
  long lVar1;
  ulong uStack_38;
  GLuint renderbufferID;
  
  uStack_38 = (ulong)in_EAX;
  this_00 = &(this->super_ApiCase).super_CallLogWrapper;
  glu::CallLogWrapper::glGenRenderbuffers(this_00,1,&renderbufferID);
  glu::CallLogWrapper::glBindRenderbuffer(this_00,0x8d41,renderbufferID);
  ApiCase::expectError(&this->super_ApiCase,0);
  checkRenderbufferParam
            ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,this_00,
             0x8d44,0x8056);
  ApiCase::expectError(&this->super_ApiCase,0);
  for (lVar1 = 0; lVar1 != 0xc; lVar1 = lVar1 + 4) {
    internalformat = *(GLenum *)((long)&DAT_005c7674 + lVar1);
    glu::CallLogWrapper::glRenderbufferStorage(this_00,0x8d41,internalformat,1,1);
    ApiCase::expectError(&this->super_ApiCase,0);
    checkRenderbufferParam
              ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,this_00,
               0x8d44,internalformat);
  }
  glu::CallLogWrapper::glDeleteRenderbuffers(this_00,1,&renderbufferID);
  return;
}

Assistant:

void test (void)
	{
		GLuint renderbufferID = 0;
		glGenRenderbuffers(1, &renderbufferID);
		glBindRenderbuffer(GL_RENDERBUFFER, renderbufferID);
		expectError(GL_NO_ERROR);

		checkRenderbufferParam(m_testCtx, *this, GL_RENDERBUFFER_INTERNAL_FORMAT, GL_RGBA4);
		expectError(GL_NO_ERROR);

		const GLenum requiredColorformats[] =
		{
			GL_RGBA4, GL_RGB5_A1, GL_RGB565
		};

		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(requiredColorformats); ++ndx)
		{
			glRenderbufferStorage(GL_RENDERBUFFER, requiredColorformats[ndx], 1, 1);
			expectError(GL_NO_ERROR);

			checkRenderbufferParam(m_testCtx, *this, GL_RENDERBUFFER_INTERNAL_FORMAT, requiredColorformats[ndx]);
		}

		glDeleteRenderbuffers(1, &renderbufferID);
	}